

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

void diff_ordset_insert(lyd_node *node,ly_set *ordset)

{
  undefined8 *node_00;
  diff_ordered *iter;
  diff_ordered *new_ordered;
  uint i;
  ly_set *ordset_local;
  lyd_node *node_local;
  
  new_ordered._4_4_ = 0;
  while ((new_ordered._4_4_ < ordset->number &&
         (((lys_node *)(ordset->set).s[new_ordered._4_4_]->name != node->schema ||
          ((lyd_node *)(ordset->set).s[new_ordered._4_4_]->dsc != node->parent))))) {
    new_ordered._4_4_ = new_ordered._4_4_ + 1;
  }
  if (new_ordered._4_4_ == ordset->number) {
    node_00 = (undefined8 *)calloc(1,0x30);
    *node_00 = node->schema;
    node_00[1] = node->parent;
    ly_set_add(ordset,node_00,1);
  }
  *(int *)&(ordset->set).s[new_ordered._4_4_]->ref =
       *(int *)&(ordset->set).s[new_ordered._4_4_]->ref + 1;
  return;
}

Assistant:

static void
diff_ordset_insert(struct lyd_node *node, struct ly_set *ordset)
{
    unsigned int i;
    struct diff_ordered *new_ordered, *iter;

    for (i = 0; i < ordset->number; i++) {
        iter = (struct diff_ordered *)ordset->set.g[i];
        if (iter->schema == node->schema && iter->parent == node->parent) {
            break;
        }
    }
    if (i == ordset->number) {
        /* not seen user-ordered list */
        new_ordered = calloc(1, sizeof *new_ordered);
        new_ordered->schema = node->schema;
        new_ordered->parent = node->parent;

        ly_set_add(ordset, new_ordered, LY_SET_OPT_USEASLIST);
    }
    ((struct diff_ordered *)ordset->set.g[i])->count++;
}